

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::integer_to_hex<unsigned_char,std::__cxx11::string>
          (uchar value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  bool bVar1;
  char cVar2;
  assertion_error *this;
  type_conflict2 tVar3;
  type_conflict2 tVar4;
  char_type *pcVar5;
  allocator<char> local_149;
  string local_148;
  char_type buf [255];
  
  tVar4 = 0;
  do {
    tVar3 = tVar4;
    cVar2 = '7';
    if ((value & 0xf) < 10) {
      cVar2 = '0';
    }
    buf[tVar3] = cVar2 + (value & 0xf);
    tVar4 = tVar3 + 1;
    bVar1 = 0xf < value;
    value = value >> 4;
  } while (bVar1);
  if (tVar4 != 0xff) {
    for (pcVar5 = buf + tVar3; buf <= pcVar5; pcVar5 = pcVar5 + -1) {
      std::__cxx11::string::push_back((char)result);
    }
    return tVar4;
  }
  this = (assertion_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"assertion \'p != last\' failed at  <> :0",&local_149);
  assertion_error::assertion_error(this,&local_148);
  __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    integer_to_hex(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = to_hex_character(0-(value % 16));
            }
            while ((value /= 16) && (p < last));
        }
        else
        {

            do
            {
                *p++ = to_hex_character(value % 16);
            }
            while ((value /= 16) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }